

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

size_t __thiscall
ktx::ValidationContext::calcLevelOffset
          (ValidationContext *this,size_t firstLevelOffset,size_t alignment,uint32_t level)

{
  uint in_ECX;
  unsigned_long in_RDI;
  uint32_t i;
  size_t levelOffset;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint uVar1;
  unsigned_long local_28;
  
  if (*(int *)(in_RDI + 0x44) == 0) {
    __assert_fail("header.vkFormat != VK_FORMAT_UNDEFINED",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/validate.cpp"
                  ,0x27b,"size_t ktx::ValidationContext::calcLevelOffset(size_t, size_t, uint32_t)")
    ;
  }
  if (*(int *)(in_RDI + 100) == 0) {
    if (in_ECX < *(uint *)(in_RDI + 0x8c)) {
      local_28 = align<unsigned_long>
                           (CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_RDI);
      uVar1 = *(uint *)(in_RDI + 0x8c);
      while (uVar1 = uVar1 - 1, in_ECX < uVar1) {
        calcLevelSize((ValidationContext *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
                      (uint32_t)(in_RDI >> 0x20));
        local_28 = align<unsigned_long>(CONCAT44(uVar1,in_stack_ffffffffffffffd0),in_RDI);
      }
      return local_28;
    }
    __assert_fail("level < numLevels",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/validate.cpp"
                  ,0x27e,"size_t ktx::ValidationContext::calcLevelOffset(size_t, size_t, uint32_t)")
    ;
  }
  __assert_fail("header.supercompressionScheme == KTX_SS_NONE",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/validate.cpp"
                ,0x27c,"size_t ktx::ValidationContext::calcLevelOffset(size_t, size_t, uint32_t)");
}

Assistant:

size_t ValidationContext::calcLevelOffset(size_t firstLevelOffset, size_t alignment, uint32_t level) {
    // This function is only useful when the following 2 conditions are met
    // as otherwise we have no idea what the size of a level ought to be.
    assert(header.vkFormat != VK_FORMAT_UNDEFINED);
    assert(header.supercompressionScheme == KTX_SS_NONE);

    assert(level < numLevels);
    // Calculate the expected base offset in the file
    size_t levelOffset = align(firstLevelOffset, alignment);
    for (uint32_t i = numLevels - 1; i > level; --i) {
        levelOffset += calcLevelSize(i);
        levelOffset = align(levelOffset, alignment);
    }
    return levelOffset;
}